

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

shared_ptr<mini_bus::IBaseNotifyToken<bool>_> __thiscall
mini_bus::MiniBusClient::ping(MiniBusClient *this,string_view payload)

{
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string_view command;
  shared_ptr<mini_bus::IBaseNotifyToken<bool>_> sVar1;
  string_view payload_00;
  anon_class_16_1_5476146e_for_func local_68;
  MiniBusClient *local_58;
  size_t sStack_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [24];
  MiniBusClient *this_local;
  string_view payload_local;
  
  this_local = (MiniBusClient *)payload._M_str;
  command._M_len = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)payload._M_len;
  local_38._16_8_ = command._M_len;
  payload_local._M_len = in_RCX;
  payload_local._M_str = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"PING");
  local_58 = this_local;
  sStack_50 = payload_local._M_len;
  command._M_str = (char *)local_48._M_len;
  payload_00._M_str = (char *)this_local;
  payload_00._M_len = (size_t)local_48._M_str;
  send_simple_abi_cxx11_((MiniBusClient *)local_38,command,payload_00);
  local_68.payload._M_len = (size_t)this_local;
  local_68.payload._M_str = (char *)payload_local._M_len;
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:499:44)>
            ((mini_bus *)this,
             (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_38,&local_68);
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_38);
  sVar1.super___shared_ptr<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<bool>_>)
         sVar1.super___shared_ptr<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<bool>> ping(std::string_view payload = {}) {
    return send_simple("PING", payload) >> [=](std::optional<std::string> str) { return str == payload; };
  }